

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O0

nsync_cpp_time_point_ __thiscall nsync::nsync_to_time_point_(nsync *this,nsync_time t)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration tp_dur;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  nanoseconds t_ns;
  nsync_cpp_time_point_ tp;
  nsync_time t_local;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&t_ns);
  tp_dur.__r = t.tv_sec + (long)this * 1000000000;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_30,&tp_dur.__r);
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_30);
  tVar1 = std::chrono::operator+
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&t_ns,&local_40);
  return (duration)tVar1.__d.__r;
}

Assistant:

nsync_cpp_time_point_ nsync_to_time_point_ (nsync_time t) {
	nsync_cpp_time_point_ tp;
	std::chrono::nanoseconds t_ns(NSYNC_TIME_NSEC (t) +
                                      NSYNC_NS_IN_S_ * (int64_t) NSYNC_TIME_SEC (t));
	nsync_cpp_time_point_::duration tp_dur =
		std::chrono::duration_cast<nsync_cpp_time_point_::duration>(t_ns);
	return (tp + tp_dur);
}